

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  sexp_conflict sexp_sockaddr_type_obj;
  sexp_conflict sexp_addrinfo_type_obj;
  int **local_98;
  undefined8 local_90;
  int *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  char *local_40;
  char *local_38;
  undefined8 local_30;
  long local_18;
  
  local_58 = 0x43e;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_18 = in_RDI;
  memset(&local_68,0,0x10);
  local_70 = 0x43e;
  memset(&local_80,0,0x10);
  local_88 = (int *)0x43e;
  memset(&local_98,0,0x10);
  iVar2 = strcmp(local_38,"0.11.0");
  if ((iVar2 == 0) && (iVar2 = strncmp(local_40,"cv-gm*uh",8), iVar2 == 0)) {
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_18 + 0x6080);
    *(undefined8 ***)(local_18 + 0x6080) = &local_80;
    local_98 = &local_88;
    local_90 = *(undefined8 *)(local_18 + 0x6080);
    *(int ****)(local_18 + 0x6080) = &local_98;
    uVar3 = sexp_intern(local_18,"socket-opt/sndlowat");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x13,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/rcvlowat",0x13);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x12,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/dontroute");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,5,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/rcvbuf");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,8,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/sndbuf",0x11);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,7,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/oobinline",0x14);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/keepalive",0x14);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,9,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/reuseaddr",0x14);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/broadcast",0x14);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,6,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-opt/debug",0x10);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"level/socket");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ai/numeric-host");
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,4,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ai/canonname",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ai/passive",10);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ip-proto/udp",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0x11,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ip-proto/tcp",0xc);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,6,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ip-proto/icmp",0xd);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"ip-proto/ip",0xb);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-type/raw",0xf);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,3,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-type/datagram",0x14);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"socket-type/stream",0x12);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"address-family/inet6",0x14);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,10,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"address-family/inet",0x13);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,2,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"address-family/unix",0x13);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,1,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    uVar3 = sexp_intern(local_18,"address-family/unspecified",0x1a);
    lVar1 = local_18;
    uVar5 = local_30;
    local_58 = uVar3;
    local_70 = sexp_make_integer(local_18,0,0);
    sexp_env_define(lVar1,uVar5,uVar3);
    local_58 = sexp_c_string(local_18,"addrinfo",0xffffffffffffffff);
    local_48 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_freeaddrinfo_stub",sexp_freeaddrinfo_stub);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_48);
    lVar1 = local_18;
    *(undefined8 *)(local_48 + 0x18) = 0x23e;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_next",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_canonname",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_addrlen",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_addr",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_flags",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_protocol",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_socktype",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    lVar1 = local_18;
    lVar4 = local_48 + 0x18;
    uVar5 = sexp_intern(local_18,"ai_family",0xffffffffffffffff);
    sexp_push_op(lVar1,lVar4,uVar5);
    uVar5 = sexp_make_vector_op(local_18,0,2,0x11,0x3e);
    *(undefined8 *)(local_48 + 0x20) = uVar5;
    uVar5 = sexp_make_vector_op(local_18,0,2,0x11,0x3e);
    *(undefined8 *)(local_48 + 0x28) = uVar5;
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58,local_48);
    local_58 = sexp_intern(local_18,"address-info?",0xd);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_58 = sexp_c_string(local_18,"sockaddr",0xffffffffffffffff);
    local_50 = sexp_register_type_op
                         (local_18,0,0x12,local_58,0x3e,0x3e,1,1,1,1,1,0x41,1,1,1,1,1,1,1,0,
                          "sexp_finalize_c_type",sexp_finalize_c_type);
    local_70 = sexp_string_to_symbol_op(local_18,0,1,local_58);
    sexp_env_define(local_18,local_30,local_70,local_50);
    local_70 = sexp_make_type_predicate_op(local_18,0,2,local_58);
    local_58 = sexp_intern(local_18,"sockaddr?",9);
    sexp_env_define(local_18,local_30,local_58,local_70);
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"make-sockaddr",0,0,"sexp_make_sockaddr_stub",
                                 sexp_make_sockaddr_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      *(ulong *)(local_88 + 10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-next",1,0,
                                 "sexp_addrinfo_get_ai_next",sexp_addrinfo_get_ai_next,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      *(ulong *)(local_88 + 10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x48) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-canonname",1,0,
                                 "sexp_addrinfo_get_ai_canonname",sexp_addrinfo_get_ai_canonname,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x13;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x40) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-address-length",1,0,
                                 "sexp_addrinfo_get_ai_addrlen",sexp_addrinfo_get_ai_addrlen,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x38) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-address",1,0,
                                 "sexp_addrinfo_get_ai_addr",sexp_addrinfo_get_ai_addr,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      *(ulong *)(local_88 + 10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x30) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-flags",1,0,
                                 "sexp_addrinfo_get_ai_flags",sexp_addrinfo_get_ai_flags,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x28) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-protocol",1,0,
                                 "sexp_addrinfo_get_ai_protocol",sexp_addrinfo_get_ai_protocol,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x20) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-socket-type",1,0,
                                 "sexp_addrinfo_get_ai_socktype",sexp_addrinfo_get_ai_socktype,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x18) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"address-info-family",1,0,
                                 "sexp_addrinfo_get_ai_family",sexp_addrinfo_get_ai_family,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    if (((*(ulong *)(local_48 + 0x20) & 3) == 0) && (**(int **)(local_48 + 0x20) == 10)) {
      *(int **)(*(long *)(local_48 + 0x20) + 0x10) = local_88;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"%make-address-info",4,0,
                                 "sexp_25_make_address_info_stub",sexp_25_make_address_info_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      *(ulong *)(local_88 + 10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,3,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"freeaddrinfo",1,0,"sexp_freeaddrinfo_stub",
                                 sexp_freeaddrinfo_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x43e;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0xc) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"set-socket-option!",4,0,
                                 "sexp_set_socket_option_x_stub",sexp_set_socket_option_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x25;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x18) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"getsockopt",3,0,"sexp_getsockopt_stub",
                                 sexp_getsockopt_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x25;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x18) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"get-peer-name",2,0,"sexp_get_peer_name_stub",
                                 sexp_get_peer_name_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x25;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"sockaddr-port",1,0,"sexp_sockaddr_port_stub",
                                 sexp_sockaddr_port_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"sockaddr-name",1,0,"sexp_sockaddr_name_stub",
                                 sexp_sockaddr_name_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"open-socket-pair",3,0,
                                 "sexp_open_socket_pair_stub",sexp_open_socket_pair_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,3,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 0x25;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"%receive!",6,0,"sexp_25_receive_x_stub",
                                 sexp_25_receive_x_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0x10] = 0x25;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,0xd,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 0x11;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x18) = 5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x20) = 5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x28) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x30) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"%send",6,0,"sexp_25_send_stub",sexp_25_send_stub
                                 ,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0x10] = 0x25;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,0xd,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x10) = 0x11;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x18) = 5;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x20) = 5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x28) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x30) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"connect",3,0,"sexp_connect_stub",
                                 sexp_connect_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 5;
      local_88[0xb] = 0;
      local_88[0xc] = 0x25;
      local_88[0xd] = 0;
      *(ulong *)(local_88 + 0xe) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"socket",3,0,"sexp_socket_stub",sexp_socket_stub,
                                 0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 0x25;
      local_88[0xb] = 0;
      local_88[0xc] = 5;
      local_88[0xd] = 0;
      local_88[0xe] = 5;
      local_88[0xf] = 0;
      local_88[0x10] = 5;
      local_88[0x11] = 0;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"accept",3,0,"sexp_accept_stub",sexp_accept_stub,
                                 0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0x10] = 0x25;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x18) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"listen",2,0,"sexp_listen_stub",sexp_listen_stub,
                                 0);
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"bind",3,0,"sexp_bind_stub",sexp_bind_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0x10] = 0x25;
      local_88[0x11] = 0;
      uVar5 = sexp_make_vector_op(local_18,0,2,5,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x10) = (ulong)*(uint *)(local_50 + 0x50) << 1 | 1;
      *(undefined8 *)(*(long *)(local_88 + 0x12) + 0x18) = 5;
    }
    local_88 = (int *)sexp_define_foreign_aux
                                (local_18,local_30,"%get-address-info",3,0,
                                 "sexp_25_get_address_info_stub",sexp_25_get_address_info_stub,0);
    if ((((ulong)local_88 & 3) == 0) && (*local_88 == 0x1b)) {
      local_88[10] = 1;
      local_88[0xb] = 0;
      local_88[0xc] = 0x13;
      local_88[0xd] = 0;
      local_88[0xe] = 0x13;
      local_88[0xf] = 0;
      *(ulong *)(local_88 + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
      uVar5 = sexp_make_vector_op(local_18,0,2,3,1);
      *(undefined8 *)(local_88 + 0x12) = uVar5;
      *(ulong *)(*(long *)(local_88 + 0x12) + 0x10) = (ulong)*(uint *)(local_48 + 0x50) << 1 | 1;
    }
    *(undefined8 *)(local_18 + 0x6080) = local_60;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp sexp_addrinfo_type_obj;
  sexp sexp_sockaddr_type_obj;
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  name = sexp_intern(ctx, "socket-opt/sndlowat", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_SNDLOWAT));
  name = sexp_intern(ctx, "socket-opt/rcvlowat", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_RCVLOWAT));
  name = sexp_intern(ctx, "socket-opt/dontroute", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_DONTROUTE));
  name = sexp_intern(ctx, "socket-opt/rcvbuf", 17);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_RCVBUF));
  name = sexp_intern(ctx, "socket-opt/sndbuf", 17);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_SNDBUF));
  name = sexp_intern(ctx, "socket-opt/oobinline", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_OOBINLINE));
  name = sexp_intern(ctx, "socket-opt/keepalive", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_KEEPALIVE));
  name = sexp_intern(ctx, "socket-opt/reuseaddr", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_REUSEADDR));
  name = sexp_intern(ctx, "socket-opt/broadcast", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_BROADCAST));
  name = sexp_intern(ctx, "socket-opt/debug", 16);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SO_DEBUG));
  name = sexp_intern(ctx, "level/socket", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOL_SOCKET));
  name = sexp_intern(ctx, "ai/numeric-host", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AI_NUMERICHOST));
  name = sexp_intern(ctx, "ai/canonname", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AI_CANONNAME));
  name = sexp_intern(ctx, "ai/passive", 10);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AI_PASSIVE));
  name = sexp_intern(ctx, "ip-proto/udp", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_UDP));
  name = sexp_intern(ctx, "ip-proto/tcp", 12);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_TCP));
  name = sexp_intern(ctx, "ip-proto/icmp", 13);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_ICMP));
  name = sexp_intern(ctx, "ip-proto/ip", 11);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, IPPROTO_IP));
  name = sexp_intern(ctx, "socket-type/raw", 15);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOCK_RAW));
  name = sexp_intern(ctx, "socket-type/datagram", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOCK_DGRAM));
  name = sexp_intern(ctx, "socket-type/stream", 18);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, SOCK_STREAM));
  name = sexp_intern(ctx, "address-family/inet6", 20);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_INET6));
  name = sexp_intern(ctx, "address-family/inet", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_INET));
  name = sexp_intern(ctx, "address-family/unix", 19);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_UNIX));
  name = sexp_intern(ctx, "address-family/unspecified", 26);
  sexp_env_define(ctx, env, name, tmp=sexp_make_integer(ctx, AF_UNSPEC));
  name = sexp_c_string(ctx, "addrinfo", -1);
  sexp_addrinfo_type_obj = sexp_register_c_type(ctx, name, sexp_freeaddrinfo_stub);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_addrinfo_type_obj);
  sexp_type_slots(sexp_addrinfo_type_obj) = SEXP_NULL;
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_next", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_canonname", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_addrlen", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_addr", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_flags", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_protocol", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_socktype", -1));
  sexp_push(ctx, sexp_type_slots(sexp_addrinfo_type_obj), sexp_intern(ctx, "ai_family", -1));
  sexp_type_getters(sexp_addrinfo_type_obj) = sexp_make_vector(ctx, SEXP_EIGHT, SEXP_FALSE);
  sexp_type_setters(sexp_addrinfo_type_obj) = sexp_make_vector(ctx, SEXP_EIGHT, SEXP_FALSE);
  tmp = sexp_make_type_predicate(ctx, name, sexp_addrinfo_type_obj);
  name = sexp_intern(ctx, "address-info?", 13);
  sexp_env_define(ctx, env, name, tmp);
  name = sexp_c_string(ctx, "sockaddr", -1);
  sexp_sockaddr_type_obj = sexp_register_c_type(ctx, name, sexp_finalize_c_type);
  tmp = sexp_string_to_symbol(ctx, name);
  sexp_env_define(ctx, env, tmp, sexp_sockaddr_type_obj);
  tmp = sexp_make_type_predicate(ctx, name, sexp_sockaddr_type_obj);
  name = sexp_intern(ctx, "sockaddr?", 9);
  sexp_env_define(ctx, env, name, tmp);
  op = sexp_define_foreign(ctx, env, "make-sockaddr", 0, sexp_make_sockaddr_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "address-info-next", 1, sexp_addrinfo_get_ai_next);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_SEVEN, op);
  op = sexp_define_foreign(ctx, env, "address-info-canonname", 1, sexp_addrinfo_get_ai_canonname);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_SIX, op);
  op = sexp_define_foreign(ctx, env, "address-info-address-length", 1, sexp_addrinfo_get_ai_addrlen);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_FIVE, op);
  op = sexp_define_foreign(ctx, env, "address-info-address", 1, sexp_addrinfo_get_ai_addr);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_FOUR, op);
  op = sexp_define_foreign(ctx, env, "address-info-flags", 1, sexp_addrinfo_get_ai_flags);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_THREE, op);
  op = sexp_define_foreign(ctx, env, "address-info-protocol", 1, sexp_addrinfo_get_ai_protocol);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_TWO, op);
  op = sexp_define_foreign(ctx, env, "address-info-socket-type", 1, sexp_addrinfo_get_ai_socktype);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_ONE, op);
  op = sexp_define_foreign(ctx, env, "address-info-family", 1, sexp_addrinfo_get_ai_family);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  if (sexp_vectorp(sexp_type_getters(sexp_addrinfo_type_obj))) sexp_vector_set(sexp_type_getters(sexp_addrinfo_type_obj), SEXP_ZERO, op);
  op = sexp_define_foreign(ctx, env, "%make-address-info", 4, sexp_25_make_address_info_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "freeaddrinfo", 1, sexp_freeaddrinfo_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "set-socket-option!", 4, sexp_set_socket_option_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "getsockopt", 3, sexp_getsockopt_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "get-peer-name", 2, sexp_get_peer_name_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "sockaddr-port", 1, sexp_sockaddr_port_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "sockaddr-name", 1, sexp_sockaddr_name_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
  }
  op = sexp_define_foreign(ctx, env, "open-socket-pair", 3, sexp_open_socket_pair_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FILENO));
  }
  op = sexp_define_foreign(ctx, env, "%receive!", 6, sexp_25_receive_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_SIX, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_BYTES));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_TWO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_THREE, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_FOUR, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "%send", 6, sexp_25_send_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_SIX, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_BYTES));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_TWO, sexp_make_fixnum(SEXP_FIXNUM));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_THREE, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_FOUR, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "connect", 3, sexp_connect_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj));
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "socket", 3, sexp_socket_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "accept", 3, sexp_accept_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "listen", 2, sexp_listen_stub);
  op = sexp_define_foreign(ctx, env, "bind", 3, sexp_bind_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FILENO);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_sockaddr_type_obj)));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "%get-address-info", 3, sexp_25_get_address_info_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj));
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_ONE, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(sexp_type_tag(sexp_addrinfo_type_obj)));
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}